

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O2

void __thiscall yyFlexLexer::yyFlexLexer(yyFlexLexer *this,istream *arg_yyin,ostream *arg_yyout)

{
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__yyFlexLexer_00153280;
  if (arg_yyin == (istream *)0x0) {
    arg_yyin = (istream *)&std::cin;
  }
  std::istream::istream
            (&this->yyin,*(streambuf **)(arg_yyin + *(long *)(*(long *)arg_yyin + -0x18) + 0xe8));
  if (arg_yyout == (ostream *)0x0) {
    arg_yyout = (ostream *)&std::cout;
  }
  std::ostream::ostream
            (&this->yyout,*(streambuf **)(arg_yyout + *(long *)(*(long *)arg_yyout + -0x18) + 0xe8))
  ;
  ctor_common(this);
  return;
}

Assistant:

yyFlexLexer::yyFlexLexer( std::istream* arg_yyin, std::ostream* arg_yyout ):
	yyin(arg_yyin ? arg_yyin->rdbuf() : std::cin.rdbuf()),
	yyout(arg_yyout ? arg_yyout->rdbuf() : std::cout.rdbuf())
{
	ctor_common();
}